

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *S,bool ShowColors,bool ShowKindLabel)

{
  string *Range;
  string *psVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_type sVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  StringRef LineContents;
  StringRef LineContents_00;
  bool bVar10;
  int iVar11;
  uint uVar12;
  raw_ostream *prVar13;
  const_iterator cVar14;
  size_type sVar15;
  ulong uVar16;
  size_t sVar17;
  undefined8 extraout_RDX;
  byte bVar18;
  byte bVar19;
  size_t OutCol;
  long lVar20;
  ulong uVar21;
  char *Str;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  StringRef Chars;
  StringRef Text;
  undefined8 uStack_d0;
  ulong local_b0;
  string CaretLine;
  string FixItInsertionLine;
  StringRef local_40;
  
  iVar11 = (*S->_vptr_raw_ostream[6])(S);
  bVar18 = (byte)iVar11 & ShowColors;
  if (bVar18 == 1) {
    (*S->_vptr_raw_ostream[2])(S,8,1,0);
  }
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    prVar13 = raw_ostream::operator<<(S,ProgName);
    raw_ostream::operator<<(prVar13,": ");
  }
  if ((this->Filename)._M_string_length != 0) {
    bVar10 = std::operator==(&this->Filename,"-");
    if (bVar10) {
      raw_ostream::operator<<(S,"<stdin>");
    }
    else {
      raw_ostream::operator<<(S,&this->Filename);
    }
    if (this->LineNo != -1) {
      prVar13 = raw_ostream::operator<<(S,':');
      raw_ostream::operator<<(prVar13,this->LineNo);
      if (this->ColumnNo != -1) {
        prVar13 = raw_ostream::operator<<(S,':');
        raw_ostream::operator<<(prVar13,this->ColumnNo + 1);
      }
    }
    raw_ostream::operator<<(S,": ");
  }
  if (ShowKindLabel) {
    switch(this->Kind) {
    case DK_Error:
      Str = "error: ";
      if (bVar18 != 0) {
        uStack_d0 = 1;
LAB_0016ce6f:
        (*S->_vptr_raw_ostream[2])(S,uStack_d0,1,0);
      }
      break;
    case DK_Warning:
      Str = "warning: ";
      if (bVar18 != 0) {
        uStack_d0 = 5;
        goto LAB_0016ce6f;
      }
      break;
    case DK_Remark:
      Str = "remark: ";
      if (bVar18 != 0) {
        uStack_d0 = 4;
        goto LAB_0016ce6f;
      }
      break;
    case DK_Note:
      Str = "note: ";
      uStack_d0 = 0;
      if (bVar18 != 0) goto LAB_0016ce6f;
      break;
    default:
      goto switchD_0016ce2e_default;
    }
    raw_ostream::operator<<(S,Str);
switchD_0016ce2e_default:
    if (bVar18 == 0) {
      prVar13 = raw_ostream::operator<<(S,&this->Message);
      raw_ostream::operator<<(prVar13,'\n');
      goto LAB_0016cee5;
    }
    (*S->_vptr_raw_ostream[3])(S);
    (*S->_vptr_raw_ostream[2])(S,8,1,0);
  }
  prVar13 = raw_ostream::operator<<(S,&this->Message);
  raw_ostream::operator<<(prVar13,'\n');
  if (bVar18 != 0) {
    (*S->_vptr_raw_ostream[3])(S);
  }
LAB_0016cee5:
  if ((this->LineNo != -1) && (this->ColumnNo != -1)) {
    Range = &this->LineContents;
    cVar14 = find_if<std::__cxx11::string_const&,bool(*)(char)>(Range,isNonASCII);
    psVar1 = &this->LineContents;
    uVar24 = (this->LineContents)._M_string_length;
    LineContents.Data = (psVar1->_M_dataplus)._M_p;
    LineContents.Length = psVar1->_M_string_length;
    if (cVar14._M_current != (psVar1->_M_dataplus)._M_p + uVar24) {
      printSourceLine(S,LineContents);
      return;
    }
    CaretLine._M_dataplus._M_p = (pointer)&CaretLine.field_2;
    std::__cxx11::string::_M_construct((ulong)&CaretLine,(char)uVar24 + '\x01');
    ppVar3 = (this->Ranges).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = (this->Ranges).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar22 = 0; ((ulong)((long)ppVar3 - (long)ppVar4) >> 3 & 0xffffffff) != uVar22;
        uVar22 = uVar22 + 1) {
      ppVar5 = (this->Ranges).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)ppVar5[uVar22].first;
      uVar16 = (ulong)ppVar5[uVar22].second;
      if (CONCAT44(CaretLine._M_string_length._4_4_,(uint)CaretLine._M_string_length) < uVar16) {
        uVar16 = CONCAT44(CaretLine._M_string_length._4_4_,(uint)CaretLine._M_string_length);
      }
      sVar17 = uVar16 - uVar23;
      if (sVar17 != 0) {
        memset(CaretLine._M_dataplus._M_p + uVar23,0x7e,sVar17);
      }
    }
    FixItInsertionLine._M_dataplus._M_p = (pointer)&FixItInsertionLine.field_2;
    FixItInsertionLine._M_string_length = 0;
    FixItInsertionLine.field_2._M_local_buf[0] = '\0';
    uVar22 = (ulong)(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                    super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                    super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
    uVar12 = this->ColumnNo;
    if (uVar22 != 0) {
      sVar6 = (this->LineContents)._M_string_length;
      uVar23 = (long)(this->Loc).Ptr - (long)(int)uVar12;
      pvVar7 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
               super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
               super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
      uVar16 = uVar23 + sVar6;
      local_b0 = 0;
      for (lVar20 = 0; uVar22 * 0x30 != lVar20; lVar20 = lVar20 + 0x30) {
        puVar2 = (undefined8 *)((long)pvVar7 + lVar20 + 0x10);
        local_40.Data = (char *)*puVar2;
        local_40.Length = puVar2[1];
        Chars.Length = 3;
        Chars.Data = "\n\r\t";
        sVar15 = StringRef::find_first_of(&local_40,Chars,0);
        if (sVar15 == 0xffffffffffffffff) {
          uVar21 = *(ulong *)((long)pvVar7 + lVar20);
          uVar8 = *(ulong *)((long)pvVar7 + lVar20 + 8);
          Text.Length._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
          Text.Length._0_1_ = uVar8 < uVar23 || uVar16 < uVar21;
          if (uVar8 >= uVar23 && uVar16 >= uVar21) {
            uVar12 = (int)uVar21 - (int)uVar23;
            if (uVar21 < uVar23) {
              uVar12 = 0;
            }
            uVar21 = (ulong)uVar12;
            Text.Data = *(char **)((long)pvVar7 + lVar20 + 0x18);
            iVar11 = sys::locale::columnWidth(*(locale **)((long)pvVar7 + lVar20 + 0x10),Text);
            sVar17 = (size_t)iVar11;
            if (*(size_t *)((long)pvVar7 + lVar20 + 0x18) != sVar17) {
              __assert_fail("(size_t)sys::locale::columnWidth(I->getText()) == I->getText().size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                            ,0x141,
                            "void buildFixItLine(std::string &, std::string &, ArrayRef<SMFixIt>, ArrayRef<char>)"
                           );
            }
            uVar9 = (int)local_b0 + 1;
            if (local_b0 <= uVar21) {
              uVar9 = uVar12;
            }
            local_b0 = (ulong)(iVar11 + uVar9);
            if (FixItInsertionLine._M_string_length < local_b0) {
              std::__cxx11::string::resize((ulong)&FixItInsertionLine,(char)(iVar11 + uVar9));
              sVar17 = *(size_t *)((long)pvVar7 + lVar20 + 0x18);
            }
            if (sVar17 != 0) {
              memmove(FixItInsertionLine._M_dataplus._M_p + uVar9,
                      *(void **)((long)pvVar7 + lVar20 + 0x10),sVar17);
            }
            uVar12 = (int)uVar8 - (int)uVar23;
            if (uVar16 <= uVar8) {
              uVar12 = (uint)sVar6;
            }
            if (uVar12 - uVar21 != 0) {
              memset(CaretLine._M_dataplus._M_p + uVar21,0x7e,uVar12 - uVar21);
            }
          }
        }
      }
      uVar12 = this->ColumnNo;
    }
    uVar22 = (long)(int)uVar12;
    if (uVar24 < uVar12) {
      uVar22 = uVar24;
    }
    CaretLine._M_dataplus._M_p[uVar22] = '^';
    lVar20 = std::__cxx11::string::find_last_not_of((char)&CaretLine,0x20);
    std::__cxx11::string::erase((ulong)&CaretLine,lVar20 + 1);
    LineContents_00.Data = (this->LineContents)._M_dataplus._M_p;
    LineContents_00.Length = (this->LineContents)._M_string_length;
    printSourceLine(S,LineContents_00);
    if (bVar18 != 0) {
      (*S->_vptr_raw_ostream[2])(S,2,1,0);
    }
    bVar19 = 0;
    for (uVar24 = 0; uVar24 != (uint)CaretLine._M_string_length; uVar24 = uVar24 + 1) {
      if ((uVar24 < (this->LineContents)._M_string_length) &&
         ((Range->_M_dataplus)._M_p[uVar24] == '\t')) {
        do {
          raw_ostream::operator<<(S,CaretLine._M_dataplus._M_p[uVar24]);
          bVar19 = bVar19 + 1;
        } while ((bVar19 & 7) != 0);
      }
      else {
        raw_ostream::operator<<(S,CaretLine._M_dataplus._M_p[uVar24]);
        bVar19 = bVar19 + 1;
      }
    }
    raw_ostream::operator<<(S,'\n');
    if (bVar18 != 0) {
      (*S->_vptr_raw_ostream[3])(S);
    }
    sVar6 = FixItInsertionLine._M_string_length;
    if (FixItInsertionLine._M_string_length != 0) {
      bVar18 = 0;
      for (uVar24 = 0; uVar24 < sVar6; uVar24 = uVar24 + 1) {
        if ((uVar24 < (this->LineContents)._M_string_length) &&
           ((Range->_M_dataplus)._M_p[uVar24] == '\t')) {
          do {
            raw_ostream::operator<<(S,FixItInsertionLine._M_dataplus._M_p[uVar24]);
            uVar24 = (FixItInsertionLine._M_dataplus._M_p[uVar24] != ' ') + uVar24;
            bVar18 = bVar18 + 1;
            if ((bVar18 & 7) == 0) break;
          } while (uVar24 != sVar6);
        }
        else {
          raw_ostream::operator<<(S,FixItInsertionLine._M_dataplus._M_p[uVar24]);
          bVar18 = bVar18 + 1;
        }
      }
      raw_ostream::operator<<(S,'\n');
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &S, bool ShowColors,
                         bool ShowKindLabel) const {
  // Display colors only if OS supports colors.
  ShowColors &= S.has_colors();

  if (ShowColors)
    S.changeColor(raw_ostream::SAVEDCOLOR, true);

  if (ProgName && ProgName[0])
    S << ProgName << ": ";

  if (!Filename.empty()) {
    if (Filename == "-")
      S << "<stdin>";
    else
      S << Filename;

    if (LineNo != -1) {
      S << ':' << LineNo;
      if (ColumnNo != -1)
        S << ':' << (ColumnNo+1);
    }
    S << ": ";
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      if (ShowColors)
        S.changeColor(raw_ostream::RED, true);
      S << "error: ";
      break;
    case SourceMgr::DK_Warning:
      if (ShowColors)
        S.changeColor(raw_ostream::MAGENTA, true);
      S << "warning: ";
      break;
    case SourceMgr::DK_Note:
      if (ShowColors)
        S.changeColor(raw_ostream::BLACK, true);
      S << "note: ";
      break;
    case SourceMgr::DK_Remark:
      if (ShowColors)
        S.changeColor(raw_ostream::BLUE, true);
      S << "remark: ";
      break;
    }

    if (ShowColors) {
      S.resetColor();
      S.changeColor(raw_ostream::SAVEDCOLOR, true);
    }
  }

  S << Message << '\n';

  if (ShowColors)
    S.resetColor();

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(S, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(S, LineContents);

  if (ShowColors)
    S.changeColor(raw_ostream::GREEN, true);

  // Print out the caret line, matching tabs in the source line.
  for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << CaretLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << CaretLine[i];
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';

  if (ShowColors)
    S.resetColor();

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  S << '\n';
}